

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
 __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Tuple_impl<0UL,_testing::internal::ValueArray<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
  *in_RSI;
  ParamGenerator<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  PVar1;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
  local_40;
  
  this_00 = (CartesianProductGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             *)operator_new(0x28);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
  ::
  _Tuple_impl<testing::internal::ValueArray<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
              *)&local_40,in_RSI);
  CartesianProductGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
  ::CartesianProductGenerator
            (this_00,(tuple<testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                      *)&local_40);
  std::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>>const,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>>,void>
            ((__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>>const,(__gnu_cxx::_Lock_policy)2>
              *)this,(ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
                      *)this_00);
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
  ::~_Tuple_impl(&local_40);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }